

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Cos::~Cos(Cos *this)

{
  CFloatFunc1::~CFloatFunc1((CFloatFunc1 *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

Cos			(void) : TrigFunc("cos", deCos, -1.0, 1.0) {}